

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O2

PaError Pa_UpdateAvailableDeviceList(void)

{
  int iVar1;
  int iVar2;
  _func_PaError_PaUtilHostApiRepresentation_ptr_PaHostApiIndex_void_ptr_ptr_int_ptr *p_Var3;
  _func_PaError_PaUtilHostApiRepresentation_ptr_void_ptr_int *p_Var4;
  PaUtilHostApiRepresentation *pPVar5;
  PaError PVar6;
  PaError PVar7;
  int iVar8;
  void **block;
  int *block_00;
  int iVar9;
  int iVar10;
  long lVar11;
  int j;
  int *piVar12;
  long lVar13;
  void **ppvVar14;
  
  if (initializationCount_ == 0) {
    PVar6 = -10000;
  }
  else {
    block = (void **)PaUtil_AllocateMemory((long)hostApisCount_ << 3);
    if (block == (void **)0x0) {
      PVar6 = -0x2708;
    }
    else {
      block_00 = (int *)PaUtil_AllocateMemory((long)hostApisCount_ << 2);
      if (block_00 == (int *)0x0) {
        PVar6 = -0x2708;
      }
      else {
        piVar12 = block_00;
        ppvVar14 = block;
        iVar9 = hostApisCount_;
        for (lVar11 = 0; lVar11 < iVar9; lVar11 = lVar11 + 1) {
          p_Var3 = hostApis_[lVar11]->ScanDeviceInfos;
          if ((p_Var3 != (_func_PaError_PaUtilHostApiRepresentation_ptr_PaHostApiIndex_void_ptr_ptr_int_ptr
                          *)0x0) &&
             (PVar6 = (*p_Var3)(hostApis_[lVar11],(int)lVar11,ppvVar14,piVar12),
             iVar9 = hostApisCount_, PVar6 != 0)) break;
          piVar12 = piVar12 + 1;
          ppvVar14 = ppvVar14 + 1;
        }
        if ((int)lVar11 < iVar9) {
          PVar6 = 0;
          for (lVar13 = 0; lVar11 != lVar13; lVar13 = lVar13 + 1) {
            p_Var4 = hostApis_[lVar13]->DisposeDeviceInfos;
            if (p_Var4 != (_func_PaError_PaUtilHostApiRepresentation_ptr_void_ptr_int *)0x0) {
              (*p_Var4)(hostApis_[lVar13],block[lVar13],block_00[lVar13]);
            }
          }
        }
        else {
          deviceCount_ = 0;
          PVar6 = 0;
          iVar10 = 0;
          for (lVar11 = 0; lVar11 < iVar9; lVar11 = lVar11 + 1) {
            pPVar5 = hostApis_[lVar11];
            if (pPVar5->CommitDeviceInfos ==
                (_func_PaError_PaUtilHostApiRepresentation_ptr_PaHostApiIndex_void_ptr_int *)0x0) {
              iVar8 = (pPVar5->info).deviceCount;
            }
            else {
              PVar7 = (*pPVar5->CommitDeviceInfos)
                                (pPVar5,(PaHostApiIndex)lVar11,block[lVar11],block_00[lVar11]);
              iVar9 = hostApisCount_;
              if (PVar7 != 0) {
                PVar6 = -0x2702;
                break;
              }
              iVar8 = (pPVar5->info).deviceCount;
              iVar1 = (pPVar5->info).defaultInputDevice;
              if (iVar8 <= iVar1) {
                __assert_fail("hostApi->info.defaultInputDevice < hostApi->info.deviceCount",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_front.c"
                              ,0x34c,"PaError Pa_UpdateAvailableDeviceList(void)");
              }
              iVar2 = (pPVar5->info).defaultOutputDevice;
              if (iVar8 <= iVar2) {
                __assert_fail("hostApi->info.defaultOutputDevice < hostApi->info.deviceCount",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_front.c"
                              ,0x34d,"PaError Pa_UpdateAvailableDeviceList(void)");
              }
              (pPVar5->privatePaFrontInfo).baseDeviceIndex = (long)iVar10;
              if (iVar1 != -1) {
                (pPVar5->info).defaultInputDevice = iVar1 + iVar10;
              }
              if (iVar2 != -1) {
                (pPVar5->info).defaultOutputDevice = iVar2 + iVar10;
              }
            }
            deviceCount_ = deviceCount_ + iVar8;
            iVar10 = iVar10 + iVar8;
          }
        }
      }
      PaUtil_FreeMemory(block);
      if (block_00 != (int *)0x0) {
        PaUtil_FreeMemory(block_00);
      }
    }
  }
  return PVar6;
}

Assistant:

PaError Pa_UpdateAvailableDeviceList( void )
{
    PaError result     = paNoError;
    void **scanResults = NULL;
    int  *deviceCounts = NULL;
    int i = 0;

    PA_LOGAPI_ENTER( "Pa_UpdateAvailableDeviceList" );
    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;
        goto done;
    }

    /* Allocate data structures used in 2-stage commit */
    scanResults = (void **) PaUtil_AllocateMemory( sizeof(void*) * hostApisCount_ );
    if( !scanResults )
    {
        result = paInsufficientMemory;
        goto done;
    }

    deviceCounts = ( int * ) PaUtil_AllocateMemory( sizeof( int ) * hostApisCount_ );
    if( !deviceCounts )
    {
        result = paInsufficientMemory;
        goto done;
    }

    /* Phase 1: Perform a scan of new devices */
    for( i = 0 ; i < hostApisCount_ ; ++i )
    {
        PaUtilHostApiRepresentation *hostApi = hostApis_[i];
        PA_DEBUG(( "Scanning new device list for host api %d.\n",i));
        if( hostApi->ScanDeviceInfos == NULL )
            continue;

        if( hostApi->ScanDeviceInfos( hostApi, i, &scanResults[ i ], &deviceCounts[ i ] ) != paNoError )
            break;
    }

    /* Check the result of the scan operation */
    if( i < hostApisCount_ )
    {
        /* If failure, rollback the scan changes back to original state */
        int j = 0;
        for( j = 0 ; j < i ; ++j )
        {
            PaUtilHostApiRepresentation *hostApi = hostApis_[j];
            if( hostApi->DisposeDeviceInfos == NULL )
                continue;

            PA_DEBUG(( "Performing rollback for device list scan for host api %d.\n",i));
            hostApi->DisposeDeviceInfos( hostApi, scanResults[ j ], deviceCounts[ j ] );
        }
    }
    else
    {
        int baseDeviceIndex = 0;
        deviceCount_ = 0;

        /* Otherwise, commit the scan changes to each back-end */
        for( i = 0 ; i < hostApisCount_ ; ++i )
        {
            PaUtilHostApiRepresentation *hostApi = hostApis_[i];
            if( hostApi->CommitDeviceInfos == NULL )
            {
                /* Not yet implemented for this backend. Just
                   assume that the baseDeviceIndex and the paInternalInfo_.deviceCount_ are
                   incremented according to the values in the info */
                baseDeviceIndex += hostApi->info.deviceCount;
                deviceCount_ += hostApi->info.deviceCount;
                continue;
            }

            PA_DEBUG(( "Committing device list scan for host api %d.\n",i));
            if( hostApi->CommitDeviceInfos( hostApi, i, scanResults[ i ], deviceCounts[ i ] ) != paNoError )
            {
                PA_DEBUG(( "Committing failed (shouldn't happen) %d.\n",i));
                result = paInternalError;
                goto done;
            }

            assert( hostApi->info.defaultInputDevice < hostApi->info.deviceCount );
            assert( hostApi->info.defaultOutputDevice < hostApi->info.deviceCount );

            hostApi->privatePaFrontInfo.baseDeviceIndex = baseDeviceIndex;

            if( hostApi->info.defaultInputDevice != paNoDevice )
                hostApi->info.defaultInputDevice += baseDeviceIndex;

            if( hostApi->info.defaultOutputDevice != paNoDevice )
                hostApi->info.defaultOutputDevice += baseDeviceIndex;

            baseDeviceIndex += hostApi->info.deviceCount;
            deviceCount_ += hostApi->info.deviceCount;
        }
    }

done:

    if( scanResults )
        PaUtil_FreeMemory( scanResults );

    if( deviceCounts )
        PaUtil_FreeMemory( deviceCounts );

    return result;
}